

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigFlagsTable.h
# Opt level: O0

void __thiscall
Js::RangeBase<int>::Add(RangeBase<int> *this,int i,int j,RangeBase<int> *oppositeRange)

{
  RangeUnit<int> RVar1;
  RangeUnit<int> unit_00;
  code *pcVar2;
  RangeUnit<int> unit_01;
  RangeUnit<int> unit_02;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  Type *pTVar8;
  undefined8 *in_FS_OFFSET;
  Type local_a4;
  Unit topUnit;
  Unit lowUnit;
  IntersectionCase intersectionCase;
  bool c4;
  bool c3;
  bool c2;
  bool c1;
  Unit *unit;
  EditingIterator it;
  RangeUnit<int> local_28;
  RangeUnit<int> a;
  RangeBase<int> *oppositeRange_local;
  int j_local;
  int i_local;
  RangeBase<int> *this_local;
  
  a = (RangeUnit<int>)oppositeRange;
  RangeUnit<int>::RangeUnit(&local_28,i,j);
  SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
            (&this->range,&local_28);
  if (a != (RangeUnit<int>)0x0) {
    bVar3 = SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Empty
                      ((SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *)a);
    RVar1 = a;
    if (bVar3) {
      it.super_EditingIterator.last = (NodeBase *)GetFullRange<int>();
      SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Prepend
                ((SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *)RVar1,
                 (RangeUnit<int> *)&it.super_EditingIterator.last);
    }
    SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::GetEditingIterator
              ((EditingIterator *)&unit,
               (SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount> *)a);
    while (bVar3 = SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::
                   EditingIterator::Next((EditingIterator *)&unit), bVar3) {
      pTVar8 = SListBase<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::Iterator::
               Data((Iterator *)&unit);
      RVar1.i = pTVar8->i;
      RVar1.j = pTVar8->j;
      bVar3 = RangeUnitContains<int>(RVar1,i);
      unit_00.i = pTVar8->i;
      unit_00.j = pTVar8->j;
      bVar4 = RangeUnitContains<int>(unit_00,j);
      unit_01.j = local_28.j;
      unit_01.i = local_28.i;
      bVar5 = RangeUnitContains<int>(unit_01,pTVar8->i);
      unit_02.j = local_28.j;
      unit_02.i = local_28.i;
      bVar6 = RangeUnitContains<int>(unit_02,pTVar8->j);
      switch(bVar3 + bVar4 * '\x02' + bVar5 * '\x04' + bVar6 * '\b') {
      case '\0':
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ConfigFlagsTable.h"
                                    ,0x3c4,"((0))","UNREACHED");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
        break;
      case '\x03':
        topUnit = *pTVar8;
        local_a4 = *pTVar8;
        iVar7 = GetPrevious<int>(local_28.i);
        topUnit.j = iVar7;
        iVar7 = GetNext<int>(local_28.j);
        local_a4.i = iVar7;
        SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::EditingIterator::
        InsertBefore((EditingIterator *)&unit,&topUnit);
        SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::EditingIterator::
        InsertBefore((EditingIterator *)&unit,&local_a4);
        SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::EditingIterator::
        RemoveCurrent((EditingIterator *)&unit);
        break;
      case '\x06':
      case '\a':
        iVar7 = GetNext<int>(local_28.j);
        pTVar8->i = iVar7;
        break;
      case '\t':
      case '\v':
        iVar7 = GetPrevious<int>(local_28.i);
        pTVar8->j = iVar7;
        break;
      case '\f':
      case '\r':
      case '\x0e':
      case '\x0f':
        SList<Js::RangeUnit<int>,_Memory::NoCheckHeapAllocator,_RealCount>::EditingIterator::
        RemoveCurrent((EditingIterator *)&unit);
      }
    }
  }
  return;
}

Assistant:

void
RangeBase<TRangeUnitData>::Add(TRangeUnitData i, TRangeUnitData j, RangeBase<TRangeUnitData>* oppositeRange)
{
    RangeUnit<TRangeUnitData> a(i, j);
    range.Prepend(a);
    if (oppositeRange)
    {
        if (oppositeRange->range.Empty())
        {
            oppositeRange->range.Prepend(GetFullRange<TRangeUnitData>());
        }
        // Do an intersection
        auto it = oppositeRange->range.GetEditingIterator();
        while (it.Next())
        {
            Unit& unit = it.Data();
            bool c1 = RangeUnitContains(unit, i);
            bool c2 = RangeUnitContains(unit, j);
            bool c3 = RangeUnitContains(a, unit.i);
            bool c4 = RangeUnitContains(a, unit.j);
            enum IntersectionCase
            {
                NoIntersection = 0,
                AddedFullyContained = 3, // [ u [a] ]
                IntersectionAdded_Unit = 6, // [ a [ ] u ]
                CommonLowBound_Unit = 7, // [[ a ] u ]
                IntersectionUnit_Added = 9, // [ u [ ] a ]
                CommonTopBound_Unit = 11, // [ u [ a ]]
                UnitFullyContained = 12, // [ a [u] ]
                CommonLowBound_Added = 13, // [[ u ] a ]
                CommonTopBound_Added = 14, // [ a [ u ]]
                FullIntersection = 15 // [[a, u]]
            };
            IntersectionCase intersectionCase = (IntersectionCase)((int)c1 | (c2 << 1) | (c3 << 2) | (c4 << 3));
            switch (intersectionCase)
            {
            case NoIntersection:
                // Nothing to do
                break;
            case AddedFullyContained:
            {
                // Need to break the current in 2
                Unit lowUnit = unit;
                Unit topUnit = unit;
                lowUnit.j = GetPrevious(a.i);
                topUnit.i = GetNext(a.j);
                it.InsertBefore(lowUnit);
                it.InsertBefore(topUnit);
                it.RemoveCurrent();
                break;
            }
            case IntersectionAdded_Unit:
            case CommonLowBound_Unit:
                // Move the unit lower bound after the added upper bound
                unit.i = GetNext(a.j);
                break;
            case IntersectionUnit_Added:
            case CommonTopBound_Unit:
                // Move the unit upper bound before the added lower bound
                unit.j = GetPrevious(a.i);
                break;
            case CommonTopBound_Added:
            case CommonLowBound_Added:
            case UnitFullyContained:
            case FullIntersection:
                // Remove the unit
                it.RemoveCurrent();
                break;
            default:
                Assert(UNREACHED);
                break;
            }
        }
    }
}